

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

void __thiscall SAT::topLevelCleanUp(SAT *this)

{
  vec<Clause_*> *pvVar1;
  ostream *poVar2;
  vec<Lit> *pvVar3;
  ulong uVar4;
  int in_stack_ffffffffffffffac;
  string local_50 [32];
  
  for (uVar4 = (ulong)((this->rtrail).data)->sz; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
    free(((this->rtrail).data)->data[uVar4 - 1]);
  }
  pvVar1 = (this->rtrail).data;
  if (pvVar1->data != (Clause **)0x0) {
    pvVar1->sz = 0;
  }
  if ((so.sat_simplify != false) && (this->next_simp_db <= this->propagations)) {
    simplifyDB(this);
  }
  pvVar3 = (this->trail).data;
  for (uVar4 = 0; uVar4 < pvVar3->sz; uVar4 = uVar4 + 1) {
    if (so.debug == true) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"setting true at top-level: ");
      getLitString_abi_cxx11_(in_stack_ffffffffffffffac);
      poVar2 = std::operator<<(poVar2,local_50);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string(local_50);
      pvVar3 = (this->trail).data;
    }
    (this->seen).data[(uint)(pvVar3->data[uVar4].x >> 1)] = '\x01';
    pvVar3 = (this->trail).data;
    (this->trailpos).data[(uint)(pvVar3->data[uVar4].x >> 1)] = -1;
  }
  if (pvVar3->data != (Lit *)0x0) {
    pvVar3->sz = 0;
  }
  *(this->qhead).data = 0;
  return;
}

Assistant:

void SAT::topLevelCleanUp() {
	assert(decisionLevel() == 0);

	for (int i = rtrail[0].size(); i-- > 0;) {
		free(rtrail[0][i]);
	}
	rtrail[0].clear();

	if (so.sat_simplify && propagations >= next_simp_db) {
		simplifyDB();
	}

	for (unsigned int i = 0; i < trail[0].size(); i++) {
		if (so.debug) {
			std::cerr << "setting true at top-level: " << getLitString(toInt(trail[0][i])) << "\n";
		}
		seen[var(trail[0][i])] = 1;
		trailpos[var(trail[0][i])] = -1;
	}
	trail[0].clear();
	qhead[0] = 0;
}